

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O1

void __thiscall MeshLib::List<char>::Append(List<char> *this,char *t)

{
  ListNode<char> *pLVar1;
  ListNode<char> *pLVar2;
  List<char> *pLVar3;
  ListNode<char> *pLVar4;
  
  pLVar2 = (ListNode<char> *)operator_new(0x10);
  pLVar2->m_data = t;
  pLVar2->m_next = (ListNode<char> *)0x0;
  pLVar3 = this;
  pLVar1 = this->m_head;
  if (this->m_head != (ListNode<char> *)0x0) {
    do {
      pLVar4 = pLVar1;
      pLVar1 = pLVar4->m_next;
    } while (pLVar1 != (ListNode<char> *)0x0);
    pLVar3 = (List<char> *)&pLVar4->m_next;
  }
  pLVar3->m_head = pLVar2;
  pLVar2->m_next = (ListNode<char> *)0x0;
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void List<T>::Append( T * t )
{
	ListNode<T> * h = m_head;

	h = new ListNode<T>(t);
	
	append( h );
	return;

}